

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_read_int8(char **data,int8_t *ret)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool local_49;
  char *pcStack_38;
  uint8_t c;
  char *p;
  uint64_t uval;
  int64_t ival;
  int8_t *ret_local;
  char **data_local;
  
  pcStack_38 = *data;
  ival = (int64_t)ret;
  ret_local = (int8_t *)data;
  bVar1 = mp_load_u8(&stack0xffffffffffffffc8);
  uVar2 = bVar1 - 0xcc;
  if (uVar2 < 7 || bVar1 == 0xd3) {
    iVar3 = (*(code *)(&DAT_001567e0 + *(int *)(&DAT_001567e0 + (ulong)uVar2 * 4)))();
    return iVar3;
  }
  local_49 = (char)bVar1 < -0x20;
  if (local_49) {
    data_local._4_4_ = -1;
  }
  else {
    *(byte *)ival = bVar1;
    *(char **)ret_local = pcStack_38;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL int
mp_read_int8(const char **data, int8_t *ret)
{
	int64_t ival;
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t)mp_load_u8(&p);
		goto commit;
	case 0xd1:
		ival = (int16_t)mp_load_u16(&p);
		goto handle_signed;
	case 0xd2:
		ival = (int32_t)mp_load_u32(&p);
		goto handle_signed;
	case 0xd3:
		ival = (int64_t)mp_load_u64(&p);
		goto handle_signed;
	case 0xcc:
		uval = mp_load_u8(&p);
		goto handle_unsigned;
	case 0xcd:
		uval = mp_load_u16(&p);
		goto handle_unsigned;
	case 0xce:
		uval = mp_load_u32(&p);
		goto handle_unsigned;
	case 0xcf:
		uval = mp_load_u64(&p);
		goto handle_unsigned;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		goto commit;
	}
handle_signed:
	if (mp_unlikely(ival > INT8_MAX || ival < INT8_MIN))
		return -1;
	*ret = (int8_t)ival;
	goto commit;
handle_unsigned:
	if (mp_unlikely(uval > INT8_MAX))
		return -1;
	*ret = (int8_t)uval;
	goto commit;
commit:
	*data = p;
	return 0;
}